

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     VoidFinalize<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_40;
  
  local_40.result = result;
  local_40.input = aggr_input_data;
  if (states->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    local_40.result_idx = 0;
    VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
    ::Finalize<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>>
              (*(ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> **)states->data,&local_40);
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = states->data;
    if (count != 0) {
      iVar2 = 0;
      do {
        local_40.result_idx = offset + iVar2;
        VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
        ::Finalize<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>>
                  (*(ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> **)(pdVar1 + iVar2 * 8),
                   &local_40);
        iVar2 = iVar2 + 1;
      } while (count != iVar2);
    }
  }
  return;
}

Assistant:

static void VoidFinalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                         idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<STATE_TYPE>(**sdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<STATE_TYPE>(*sdata[i], finalize_data);
			}
		}
	}